

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

ArrayXZ * __thiscall IMLE::getMultiplePredictionsJacobian(IMLE *this)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  DenseStorage<double,__1,__1,__1,_0> *pDVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  pointer pMVar11;
  pointer pMVar12;
  pointer pFVar13;
  IMLE *pIVar14;
  undefined8 *puVar15;
  long lVar16;
  void *pvVar17;
  Index size;
  long lVar18;
  double *pdVar19;
  Index col;
  long lVar20;
  ulong uVar21;
  long lVar22;
  Index index_1;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  Index row_2;
  pointer pMVar29;
  ActualDstType actualDst_3;
  Index inner_1;
  ulong uVar30;
  Index inner;
  XprTypeNested pMVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Mat weightedKappa;
  add local_191;
  long local_190;
  false_type local_181;
  IMLE *local_180;
  long local_178;
  double *local_170;
  Mat *local_168;
  Mat *local_160;
  long local_158;
  pointer local_150;
  XprTypeNested local_148;
  void *local_140;
  ulong local_138;
  Mat *local_128;
  undefined1 local_120 [16];
  PointerType local_110;
  Mat *local_108;
  variable_if_dynamic<long,__1> local_100;
  variable_if_dynamic<long,__1> local_f8;
  XprTypeNested local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  variable_if_dynamic<long,__1> local_c0;
  variable_if_dynamic<long,__1> local_b8;
  variable_if_dynamic<long,__1> local_b0;
  long local_a8;
  Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> local_a0;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  if (this->hasPredJacobian == false) {
    pMVar11 = (this->predictionsJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar12 = (this->predictionsJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar29 = pMVar11;
    if (pMVar12 != pMVar11) {
      do {
        free((pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar29 = pMVar29 + 1;
      } while (pMVar29 != pMVar12);
      (this->predictionsJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar11;
    }
    pMVar11 = (this->predictionsVarJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar12 = (this->predictionsVarJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar29 = pMVar11;
    if (pMVar12 != pMVar11) {
      do {
        free((pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar29 = pMVar29 + 1;
      } while (pMVar29 != pMVar12);
      (this->predictionsVarJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar11;
    }
    iVar10 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(&this->predictionsJacobian,(long)iVar10,(value_type *)&local_48);
    free(local_48.m_data);
    iVar10 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(&this->predictionsVarJacobian,(long)iVar10,(value_type *)&local_60);
    free(local_60.m_data);
    lVar23 = (long)this->d;
    lVar16 = (long)this->M;
    if ((lVar16 != 0 && lVar23 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar16),0) < lVar23)) {
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = operator_delete;
      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_160 = &this->zeta;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)local_160,lVar16 * lVar23,lVar23,lVar16);
    local_120._0_8_ = SEXT48(this->d);
    local_120._8_8_ = SEXT48(this->nSolFound);
    local_110 = (PointerType)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_140,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_120);
    if (0 < this->M) {
      lVar16 = 0;
      do {
        pvVar17 = (void *)((long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar16] * local_138 * 8 +
                          (long)local_140);
        uVar21 = local_138;
        if ((((ulong)pvVar17 & 7) == 0) &&
           (uVar21 = (ulong)((uint)((ulong)pvVar17 >> 3) & 1), (long)local_138 <= (long)uVar21)) {
          uVar21 = local_138;
        }
        pFVar13 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar7 = pFVar13[lVar16].super_LinearExpert.p_z_T;
        lVar23 = *(long *)&pFVar13[lVar16].super_LinearExpert.kappa.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        if (0 < (long)uVar21) {
          uVar24 = 0;
          do {
            *(double *)((long)pvVar17 + uVar24 * 8) =
                 *(double *)(lVar23 + uVar24 * 8) * dVar7 + *(double *)((long)pvVar17 + uVar24 * 8);
            uVar24 = uVar24 + 1;
          } while (uVar21 != uVar24);
        }
        lVar25 = local_138 - uVar21;
        uVar24 = (lVar25 - (lVar25 >> 0x3f) & 0xfffffffffffffffeU) + uVar21;
        if (1 < lVar25) {
          do {
            pdVar1 = (double *)(lVar23 + uVar21 * 8);
            dVar8 = pdVar1[1];
            pdVar19 = (double *)((long)pvVar17 + uVar21 * 8);
            dVar9 = pdVar19[1];
            pdVar2 = (double *)((long)pvVar17 + uVar21 * 8);
            *pdVar2 = *pdVar1 * dVar7 + *pdVar19;
            pdVar2[1] = dVar8 * dVar7 + dVar9;
            uVar21 = uVar21 + 2;
          } while ((long)uVar21 < (long)uVar24);
        }
        if ((long)uVar24 < (long)local_138) {
          do {
            *(double *)((long)pvVar17 + uVar24 * 8) =
                 *(double *)(lVar23 + uVar24 * 8) * dVar7 + *(double *)((long)pvVar17 + uVar24 * 8);
            uVar24 = uVar24 + 1;
          } while (local_138 != uVar24);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->M);
    }
    local_180 = this;
    if (0 < this->M) {
      local_168 = &this->fInvRj;
      local_128 = &this->invRxj;
      local_190 = 0;
      pMVar31 = (XprTypeNested)0x0;
      do {
        pdVar1 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar21 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        uVar24 = uVar21;
        if ((((ulong)(pdVar1 + uVar21 * (long)pMVar31) & 7) == 0) &&
           (uVar24 = (ulong)((uint)((ulong)(pdVar1 + uVar21 * (long)pMVar31) >> 3) & 1),
           (long)uVar21 <= (long)uVar24)) {
          uVar24 = uVar21;
        }
        pFVar13 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar7 = pFVar13[(long)pMVar31].super_LinearExpert.p_z_T;
        lVar25 = (long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pMVar31];
        dVar9 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar25];
        lVar25 = lVar25 * local_138;
        dVar8 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[(long)pMVar31];
        lVar16 = *(long *)&pFVar13[(long)pMVar31].super_LinearExpert.dGamma.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        lVar23 = *(long *)&pFVar13[(long)pMVar31].super_LinearExpert.kappa.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        if (0 < (long)uVar24) {
          uVar30 = 0;
          do {
            *(double *)((long)pdVar1 + uVar30 * 8 + uVar21 * local_190) =
                 ((*(double *)(lVar23 + uVar30 * 8) * dVar9 +
                  *(double *)(lVar16 + uVar30 * 8) * dVar7) -
                 *(double *)((long)local_140 + uVar30 * 8 + lVar25 * 8)) / dVar8;
            uVar30 = uVar30 + 1;
          } while (uVar24 != uVar30);
        }
        lVar28 = uVar21 - uVar24;
        lVar3 = (lVar28 - (lVar28 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
        if (1 < lVar28) {
          uVar30 = uVar24;
          do {
            pdVar19 = (double *)(lVar16 + uVar30 * 8);
            pdVar2 = (double *)(lVar23 + uVar30 * 8);
            pdVar4 = (double *)((long)local_140 + uVar30 * 8 + lVar25 * 8);
            auVar33._0_8_ = (*pdVar2 * dVar9 + *pdVar19 * dVar7) - *pdVar4;
            auVar33._8_8_ = (pdVar2[1] * dVar9 + pdVar19[1] * dVar7) - pdVar4[1];
            auVar34._8_8_ = dVar8;
            auVar34._0_8_ = dVar8;
            auVar34 = divpd(auVar33,auVar34);
            *(undefined1 (*) [16])((long)pdVar1 + uVar30 * 8 + uVar21 * local_190) = auVar34;
            uVar30 = uVar30 + 2;
          } while ((long)uVar30 < lVar3);
        }
        if (lVar3 < (long)uVar21) {
          lVar3 = (lVar28 / 2) * 0x10 + uVar24 * 8;
          lVar18 = 0;
          do {
            *(double *)((long)pdVar1 + lVar18 * 8 + uVar21 * local_190 + lVar3) =
                 ((*(double *)(lVar23 + lVar3 + lVar18 * 8) * dVar9 +
                  *(double *)(lVar16 + lVar3 + lVar18 * 8) * dVar7) -
                 *(double *)((long)local_140 + lVar18 * 8 + lVar3 + lVar25 * 8)) / dVar8;
            lVar18 = lVar18 + 1;
          } while (lVar28 % 2 != lVar18);
        }
        pFVar13 = (local_180->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (local_180->fInvRj).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        local_110 = (PointerType)
                    (local_180->fInvRj).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
        local_170 = pdVar1 + (long)local_110 * (long)pMVar31;
        local_d8._8_8_ =
             (local_180->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_d8._0_8_ =
             (local_180->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data + local_d8._8_8_ * (long)pMVar31;
        local_e8._8_8_ = &pFVar13[(long)pMVar31].super_LinearExpert.Lambda;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = (local_180->zeta).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        ;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data +
               local_a0.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_rows.m_value * (long)pMVar31;
        local_100.m_value = (long)local_168;
        local_f8.m_value = 0;
        local_c0.m_value = (long)local_128;
        local_b8.m_value = 0;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             local_160;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0;
        local_150 = (local_180->predictionsJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        lVar23 = (long)(local_180->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pMVar31];
        local_158 = lVar23 * 3;
        lVar16 = local_150[lVar23].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
        if (0 < lVar16) {
          lVar25 = *(long *)&pFVar13[(long)pMVar31].super_LinearExpert.Lambda.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
          local_178 = *(Index *)((long)&pFVar13[(long)pMVar31].super_LinearExpert.Lambda + 8);
          lVar3 = (long)local_150[lVar23].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
          lVar28 = local_150[lVar23].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          lVar18 = 0;
          lVar20 = 0;
          lVar26 = lVar25;
          lVar27 = lVar3;
          do {
            if (0 < lVar18) {
              *(double *)(lVar3 + lVar20 * lVar28 * 8) =
                   *local_170 * *(double *)(lVar25 + lVar20 * local_178 * 8) +
                   *(double *)(lVar3 + lVar20 * lVar28 * 8);
            }
            uVar21 = lVar28 - lVar18 & 0xfffffffffffffffe;
            lVar32 = uVar21 + lVar18;
            lVar22 = lVar18;
            if (0 < (long)uVar21) {
              do {
                pdVar19 = (double *)(lVar26 + lVar22 * 8);
                dVar9 = pdVar19[1];
                pdVar2 = (double *)((long)pdVar1 + lVar22 * 8 + (long)local_110 * local_190);
                dVar8 = pdVar2[1];
                pdVar4 = (double *)(lVar27 + lVar22 * 8);
                dVar7 = pdVar4[1];
                pdVar5 = (double *)(lVar27 + lVar22 * 8);
                *pdVar5 = *pdVar2 * *pdVar19 + *pdVar4;
                pdVar5[1] = dVar8 * dVar9 + dVar7;
                lVar22 = lVar22 + 2;
              } while (lVar22 < lVar32);
            }
            for (; lVar32 < lVar28; lVar32 = lVar32 + 1) {
              *(double *)(lVar27 + lVar32 * 8) =
                   *(double *)((long)pdVar1 + lVar32 * 8 + (long)local_110 * local_190) *
                   *(double *)(lVar26 + lVar32 * 8) + *(double *)(lVar27 + lVar32 * 8);
            }
            lVar18 = (long)(lVar18 + (ulong)((uint)lVar28 & 1)) % 2;
            if (lVar28 < lVar18) {
              lVar18 = lVar28;
            }
            lVar20 = lVar20 + 1;
            lVar26 = lVar26 + local_178 * 8;
            lVar27 = lVar27 + lVar28 * 8;
          } while (lVar20 != lVar16);
        }
        local_148 = pMVar31;
        local_120._8_8_ = local_170;
        local_f0 = pMVar31;
        local_e8._0_8_ = local_110;
        local_b0.m_value = (long)pMVar31;
        local_a8 = local_d8._8_8_;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = (long)pMVar31;
        local_a0.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride =
             local_a0.m_matrix.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_rows.m_value;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  (local_150 + lVar23,
                   (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d8,
                   &local_a0,(sub *)&local_191,&local_181);
        pMVar31 = local_148;
        this = local_180;
        local_120._8_8_ =
             (local_180->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_120._0_8_ =
             (local_180->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data + local_120._8_8_ * (long)local_148;
        local_e8._8_8_ =
             (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_e8._0_8_ =
             (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data + local_e8._8_8_ * (long)local_148;
        local_108 = local_168;
        local_100.m_value = 0;
        local_f8.m_value = (long)local_148;
        local_d8._8_8_ = local_160;
        local_d8._16_8_ = 0;
        local_c0.m_value = (long)local_148;
        local_f0 = (XprTypeNested)local_120._8_8_;
        local_b8.m_value = local_e8._8_8_;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                  ((local_180->predictionsVarJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (local_180->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_148],
                   (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_120,
                   (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)local_e8,&local_191,&local_181);
        pMVar31 = (XprTypeNested)
                  ((long)&(pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          ).m_storage.m_data + 1);
        local_190 = local_190 + 8;
      } while ((long)pMVar31 < (long)this->M);
    }
    if (0 < this->nSolFound) {
      lVar16 = 0;
      do {
        pIVar14 = local_180;
        dVar7 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar16];
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          pMVar11 = (this->predictionsJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar23 = pMVar11[lVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if (0 < lVar23) {
            pMVar12 = (local_180->predictionsVarJacobian).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar1 = (local_180->predictions).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            local_170 = pMVar12[lVar16].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
            local_178 = pMVar12[lVar16].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows;
            lVar25 = (long)pMVar11[lVar16].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data;
            lVar3 = pMVar11[lVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_storage.m_rows;
            lVar28 = 0;
            lVar26 = 0;
            pdVar19 = local_170;
            lVar18 = lVar25;
            do {
              if (0 < lVar28) {
                *(double *)(lVar25 + lVar26 * lVar3 * 8) =
                     *pdVar1 * local_170[lVar26 * local_178] +
                     *(double *)(lVar25 + lVar26 * lVar3 * 8);
              }
              uVar21 = lVar3 - lVar28 & 0xfffffffffffffffe;
              lVar27 = uVar21 + lVar28;
              lVar20 = lVar28;
              if (0 < (long)uVar21) {
                do {
                  dVar9 = (pdVar19 + lVar20)[1];
                  dVar8 = (pdVar1 + lVar20)[1];
                  pdVar2 = (double *)(lVar18 + lVar20 * 8);
                  dVar7 = pdVar2[1];
                  pdVar4 = (double *)(lVar18 + lVar20 * 8);
                  *pdVar4 = pdVar1[lVar20] * pdVar19[lVar20] + *pdVar2;
                  pdVar4[1] = dVar8 * dVar9 + dVar7;
                  lVar20 = lVar20 + 2;
                } while (lVar20 < lVar27);
              }
              for (; lVar27 < lVar3; lVar27 = lVar27 + 1) {
                *(double *)(lVar18 + lVar27 * 8) =
                     pdVar1[lVar27] * pdVar19[lVar27] + *(double *)(lVar18 + lVar27 * 8);
              }
              lVar28 = (long)(lVar28 + (ulong)((uint)lVar3 & 1)) % 2;
              if (lVar3 < lVar28) {
                lVar28 = lVar3;
              }
              lVar26 = lVar26 + 1;
              pdVar19 = pdVar19 + local_178;
              lVar18 = lVar18 + lVar3 * 8;
            } while (lVar26 != lVar23);
          }
          local_120._0_8_ =
               (local_180->predictionsVar).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar16;
          local_120._8_8_ =
               (local_180->predictionsJacobian).
               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar16;
          local_190 = lVar16;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_120._8_8_,
                     (Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                      *)local_120,(assign_op<double,_double> *)&local_191);
          local_120._8_8_ =
               (pIVar14->predictionsVar).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar16;
          local_108 = (pIVar14->predictionsVarJacobian).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
                    (local_108,
                     (Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                      *)local_120,(assign_op<double,_double> *)&local_191);
          this = pIVar14;
        }
        else {
          pMVar11 = (this->predictionsJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
          pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar11 + lVar16);
          lVar23 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          lVar25 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pDVar6->m_rows != lVar23) ||
             (pMVar11[lVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar25)) {
            if ((lVar25 != 0 && lVar23 != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0) <
                lVar23)) goto LAB_0014f647;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar6,lVar25 * lVar23,lVar23,lVar25)
            ;
          }
          pdVar19 = pDVar6->m_data;
          lVar23 = pDVar6->m_cols * pDVar6->m_rows;
          uVar21 = lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar23) {
            lVar25 = 0;
            do {
              pdVar2 = pdVar1 + lVar25;
              dVar7 = pdVar2[1];
              pdVar4 = pdVar19 + lVar25;
              *pdVar4 = *pdVar2;
              pdVar4[1] = dVar7;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar21);
          }
          if ((long)uVar21 < lVar23) {
            do {
              pdVar19[uVar21] = pdVar1[uVar21];
              uVar21 = uVar21 + 1;
            } while (lVar23 - uVar21 != 0);
          }
          pMVar11 = (this->predictionsVarJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          ;
          pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar11 + lVar16);
          lVar23 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          lVar25 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          ;
          if ((pDVar6->m_rows != lVar23) ||
             (pMVar11[lVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar25)) {
            if ((lVar25 != 0 && lVar23 != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0) <
                lVar23)) {
LAB_0014f647:
              puVar15 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar15 = operator_delete;
              __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar6,lVar25 * lVar23,lVar23,lVar25)
            ;
          }
          pdVar19 = pDVar6->m_data;
          lVar23 = pDVar6->m_cols * pDVar6->m_rows;
          uVar21 = lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar23) {
            lVar25 = 0;
            do {
              pdVar2 = pdVar1 + lVar25;
              dVar7 = pdVar2[1];
              pdVar4 = pdVar19 + lVar25;
              *pdVar4 = *pdVar2;
              pdVar4[1] = dVar7;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar21);
          }
          if ((long)uVar21 < lVar23) {
            do {
              pdVar19[uVar21] = pdVar1[uVar21];
              uVar21 = uVar21 + 1;
            } while (lVar23 - uVar21 != 0);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->nSolFound);
    }
    this->hasPredJacobian = true;
    free(local_140);
  }
  return &this->predictionsJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}